

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cross_entropy_loss_test.cc
# Opt level: O2

void __thiscall
xLearn::CROSS_ENTROPY_LOSS_Evalute_Test::TestBody(CROSS_ENTROPY_LOSS_Evalute_Test *this)

{
  uint uVar1;
  Score *score;
  ThreadPool *this_00;
  int i;
  ulong uVar2;
  long lVar3;
  char *pcVar4;
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar5 [16];
  undefined1 extraout_var [56];
  undefined1 in_XMM2 [16];
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  AssertHelper local_a0;
  AssertionResult gtest_ar;
  real_t val;
  vector<float,_std::allocator<float>_> label;
  vector<float,_std::allocator<float>_> pred;
  CrossEntropyLoss loss;
  undefined1 auVar6 [64];
  
  std::vector<float,_std::allocator<float>_>::vector(&pred,(ulong)kLine,(allocator_type *)&loss);
  for (uVar2 = 0;
      uVar2 < (ulong)((long)pred.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)pred.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2); uVar2 = uVar2 + 1) {
    pred.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
    [uVar2] = 10000.0;
  }
  std::vector<float,_std::allocator<float>_>::vector(&label,(ulong)kLine,(allocator_type *)&loss);
  for (uVar2 = 0;
      uVar2 < (ulong)((long)label.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)label.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2); uVar2 = uVar2 + 1) {
    label.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
    [uVar2] = 1.0;
  }
  loss.super_Loss.loss_sum_ = 0.0;
  loss.super_Loss.total_example_ = 0;
  loss.super_Loss._vptr_Loss = (_func_int **)&PTR__Loss_0016dda8;
  score = (Score *)operator_new(0x58);
  (score->opt_type_)._M_dataplus._M_p = (pointer)&(score->opt_type_).field_2;
  (score->opt_type_)._M_string_length = 0;
  (score->opt_type_).field_2._M_local_buf[0] = '\0';
  score->_vptr_Score = (_func_int **)&PTR__Score_0016e3d8;
  score[1].alpha_ = 0.0;
  score[1].beta_ = 0.0;
  score[1]._vptr_Score = (_func_int **)0x0;
  score[1].learning_rate_ = 0.0;
  score[1].regu_lambda_ = 0.0;
  uVar1 = std::thread::hardware_concurrency();
  auVar6._8_56_ = extraout_var;
  auVar6._0_8_ = extraout_XMM1_Qa;
  auVar5 = auVar6._0_16_;
  this_00 = (ThreadPool *)operator_new(0x120);
  ThreadPool::ThreadPool(this_00,(ulong)uVar1);
  Loss::Initialize(&loss.super_Loss,score,this_00,true,false,0);
  CrossEntropyLoss::Evalute(&loss,&pred,&label);
  auVar5 = vcvtusi2ss_avx512f(auVar5,loss.super_Loss.total_example_);
  local_a8.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3eb0c6f7a0b5ed8d
  ;
  val = loss.super_Loss.loss_sum_ / auVar5._0_4_;
  testing::internal::CmpHelperLT<float,double>
            ((internal *)&gtest_ar,"val","0.000001",&val,(double *)&local_a8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/loss/cross_entropy_loss_test.cc"
               ,0x33,pcVar4);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_a8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  for (uVar2 = 0;
      uVar2 < (ulong)((long)pred.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)pred.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2); uVar2 = uVar2 + 1) {
    pred.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
    [uVar2] = -10000.0;
  }
  for (lVar3 = 0;
      (long)label.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)label.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_start >> 2 != lVar3; lVar3 = lVar3 + 1) {
    label.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
    [lVar3] = -1.0;
  }
  CrossEntropyLoss::Evalute(&loss,&pred,&label);
  local_a8.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3eb0c6f7a0b5ed8d
  ;
  auVar5 = vcvtusi2ss_avx512f(in_XMM2,loss.super_Loss.total_example_);
  val = loss.super_Loss.loss_sum_ / auVar5._0_4_;
  testing::internal::CmpHelperLT<float,double>
            ((internal *)&gtest_ar,"val","0.000001",&val,(double *)&local_a8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/loss/cross_entropy_loss_test.cc"
               ,0x3d,pcVar4);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_a8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&label.super__Vector_base<float,_std::allocator<float>_>);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&pred.super__Vector_base<float,_std::allocator<float>_>);
  return;
}

Assistant:

TEST(CROSS_ENTROPY_LOSS, Evalute) {
  // Create pred vector
  std::vector<real_t> pred(kLine);
  for (int i = 0; i < pred.size(); ++i) {
    pred[i] = 10000;
  }
  // Create label vector
  std::vector<real_t> label(kLine);
  for (int i = 0; i < label.size(); ++i) {
    label[i] = 1.0;
  }
  // Create loss
  CrossEntropyLoss loss;
  Score* score = new FMScore;
  size_t threadNumber = std::thread::hardware_concurrency();
  ThreadPool* pool = new ThreadPool(threadNumber);
  loss.Initialize(score, pool);
  loss.Evalute(pred, label);
  real_t val = loss.GetLoss();
  EXPECT_LT(val, 0.000001);
  // Test2
  for (int i = 0; i < pred.size(); ++i) {
    pred[i] = -10000;
  }
  for (int i = 0; i < label.size(); ++i) {
    label[i] = -1.0;
  }
  loss.Evalute(pred, label);
  val = loss.GetLoss();
  EXPECT_LT(val, 0.000001);
}